

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int fileext_n_compare(char *test_ext,char *known_ext,size_t maxlen)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char caps [8];
  
  caps[0] = '\0';
  caps[1] = '\0';
  caps[2] = '\0';
  caps[3] = '\0';
  caps[4] = '\0';
  caps[5] = '\0';
  caps[6] = '\0';
  caps[7] = '\0';
  iVar1 = strncmp(test_ext,known_ext,4);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (known_ext != (char *)0x0 && test_ext != (char *)0x0) {
    sVar2 = strlen(known_ext);
    sVar3 = 4;
    if (sVar2 < 4) {
      sVar3 = sVar2;
    }
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      iVar1 = toupper((int)known_ext[sVar2]);
      caps[sVar2] = (char)iVar1;
    }
    caps[sVar3] = '\0';
    iVar1 = strncmp(test_ext,caps,4);
  }
  return iVar1;
}

Assistant:

static int fileext_n_compare(const char * test_ext,
                             const char * known_ext, size_t maxlen)
{
   char caps[8] = "";
   size_t c,len;
   /* if equal, don't need to check case (store to avoid multiple calls) */
   const int  cmp = strncmp(test_ext, known_ext, maxlen);
   if( cmp == 0 ) return cmp;

   /* if anything odd, use default */
   if( !test_ext || !known_ext ) return cmp;

   len = strlen(known_ext);
   if( len > maxlen ) len = maxlen;     /* ignore anything past maxlen */
   if( len > 7 ) return cmp;

   /* if here, strings are different but need to check upper-case */
   for(c = 0; c < len; c++ ) caps[c] = toupper((int) known_ext[c]);
   caps[c] = '\0';

   return strncmp(test_ext, caps, maxlen);
}